

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QModelIndex * __thiscall
QFileSystemModel::sibling
          (QModelIndex *__return_storage_ptr__,QFileSystemModel *this,int row,int column,
          QModelIndex *idx)

{
  QAbstractItemModel *pQVar1;
  quintptr qVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (idx->r == row) {
    pQVar1 = (idx->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_48 = 0xffffffffffffffff;
      local_40 = 0;
      uStack_38 = 0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_48,pQVar1,idx);
    }
    iVar3 = (**(code **)(*(long *)this + 0x80))(this,&local_48);
    if (column < iVar3) {
      qVar2 = idx->i;
      __return_storage_ptr__->r = row;
      __return_storage_ptr__->c = column;
      __return_storage_ptr__->i = qVar2;
      (__return_storage_ptr__->m).ptr = &this->super_QAbstractItemModel;
      goto LAB_006107e0;
    }
  }
  QAbstractItemModel::sibling((int)__return_storage_ptr__,(int)this,(QModelIndex *)(ulong)(uint)row)
  ;
LAB_006107e0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QFileSystemModel::sibling(int row, int column, const QModelIndex &idx) const
{
    if (row == idx.row() && column < columnCount(idx.parent())) {
        // cheap sibling operation: just adjust the column:
        return createIndex(row, column, idx.internalPointer());
    } else {
        // for anything else: call the default implementation
        // (this could probably be optimized, too):
        return QAbstractItemModel::sibling(row, column, idx);
    }
}